

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void SplitBlock(CPpmd7 *p,void *ptr,uint oldIndx,uint newIndx)

{
  uint uVar1;
  void *node;
  uint k;
  uint nu;
  uint i;
  uint newIndx_local;
  uint oldIndx_local;
  void *ptr_local;
  CPpmd7 *p_local;
  
  uVar1 = (uint)p->Indx2Units[oldIndx] - (uint)p->Indx2Units[newIndx];
  node = (void *)((long)ptr + (ulong)((uint)p->Indx2Units[newIndx] * 0xc));
  k = (uint)p->Units2Indx[uVar1 - 1];
  if (p->Indx2Units[k] != uVar1) {
    k = k - 1;
    InsertNode(p,(void *)((long)node + (ulong)((uint)p->Indx2Units[k] * 0xc)),
               (uVar1 - p->Indx2Units[k]) - 1);
  }
  InsertNode(p,node,k);
  return;
}

Assistant:

static void SplitBlock(CPpmd7 *p, void *ptr, unsigned oldIndx, unsigned newIndx)
{
  unsigned i, nu = I2U(oldIndx) - I2U(newIndx);
  ptr = (Byte *)ptr + U2B(I2U(newIndx));
  if (I2U(i = U2I(nu)) != nu)
  {
    unsigned k = I2U(--i);
    InsertNode(p, ((Byte *)ptr) + U2B(k), nu - k - 1);
  }
  InsertNode(p, ptr, i);
}